

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall
flatbuffers::ts::TsGenerator::GenObjApi
          (TsGenerator *this,Parser *parser,StructDef *struct_def,string *obj_api_unpack_func,
          string *obj_api_class,import_set *imports)

{
  BaseType BVar1;
  long lVar2;
  FieldDef *pFVar3;
  IDLOptions *pIVar4;
  StructDef *pSVar5;
  Parser *__rhs;
  IdlNamer *pIVar6;
  string *psVar7;
  int iVar8;
  long *plVar9;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  _Var10;
  undefined8 *puVar11;
  size_type *psVar12;
  EnumVal **ppEVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Base_ptr *pp_Var15;
  undefined8 *puVar16;
  ulong *puVar17;
  undefined8 uVar18;
  char *pcVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  ulong uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  _Base_ptr p_Var25;
  bool bVar26;
  string field_type_name;
  Type vectortype;
  string vectortypename;
  string field_accessor;
  string field_binded_method;
  string field_field;
  string field_method;
  string constructor_func;
  string field_val;
  string unpack_to_func;
  string field_offset_decl;
  string field_type;
  string struct_name;
  string pack_func_create_call;
  string field_offset_val;
  string pack_func_prototype;
  string unpack_func;
  string pack_func_offset_decl;
  string field_default_val;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0;
  long local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  long local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  bool local_459;
  string local_458;
  FieldDef *local_438;
  string local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  TsGenerator *local_3f0;
  string local_3e8;
  Parser *local_3c8;
  _Base_ptr *local_3c0;
  long local_3b8;
  _Base_ptr local_3b0;
  long lStack_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  IdlNamer *local_380;
  string *local_378;
  ImportDefinition local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Base_ptr local_260;
  string local_258;
  byte local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  _Alloc_hider local_1e0;
  long local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130;
  undefined7 uStack_12f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  EnumVal *local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  EnumDef *local_90 [2];
  string local_80;
  StructDef *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_380 = &this->namer_;
  local_3f0 = this;
  local_378 = obj_api_class;
  (*(this->namer_).super_Namer._vptr_Namer
    [(ulong)(((this->super_BaseGenerator).parser_)->opts).generate_object_based_api * 2 + 0xf])
            (&local_50,local_380,parser);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "\nunpack(): ",&local_50);
  local_60 = struct_def;
  plVar9 = (long *)std::__cxx11::string::append(local_100._M_local_buf);
  paVar24 = &local_230.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230.field_2._8_8_ = plVar9[3];
    local_230._M_dataplus._M_p = (pointer)paVar24;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_230._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_50._M_dataplus._M_p);
  local_1e0._M_p = (pointer)&local_1d0;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar20) {
    local_1d0._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1d0._8_8_ = plVar9[3];
  }
  else {
    local_1d0._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1e0._M_p = (pointer)*plVar9;
  }
  local_1d8 = plVar9[1];
  *plVar9 = (long)paVar20;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
  local_e0._M_allocated_capacity = (size_type)&local_d0;
  ppEVar13 = (EnumVal **)(plVar9 + 2);
  if ((EnumVal **)*plVar9 == ppEVar13) {
    local_d0 = *ppEVar13;
    lStack_c8 = plVar9[3];
  }
  else {
    local_d0 = *ppEVar13;
    local_e0._M_allocated_capacity = (size_type)(EnumVal **)*plVar9;
  }
  local_e0._8_8_ = plVar9[1];
  *plVar9 = (long)ppEVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar24) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != &local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0._M_allocated_capacity + 1);
  }
  std::operator+(&local_230,"\nunpackTo(_o: ",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar20) {
    local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)paVar20;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
  local_1e0._M_p = (pointer)&local_1d0;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar20) {
    local_1d0._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1d0._8_8_ = plVar9[3];
  }
  else {
    local_1d0._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1e0._M_p = (pointer)*plVar9;
  }
  local_1d8 = plVar9[1];
  *plVar9 = (long)paVar20;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar24) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"constructor(","");
  std::__cxx11::string::append((char *)&local_230);
  local_459 = true;
  if (*(char *)&(parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right == '\0')
  {
    lVar2 = *(long *)&(parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var25 = (parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (8 < (ulong)((long)p_Var25 - lVar2)) {
      _Var10 = std::
               __find_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_negate<flatbuffers::ts::TsGenerator::CanCreateFactoryMethod(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_>>
                         (lVar2 + 8,p_Var25);
      local_459 = (_Base_ptr)_Var10._M_current == p_Var25;
    }
  }
  local_100._M_allocated_capacity = (size_type)&local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_140._M_allocated_capacity = (size_type)&local_130;
  local_140._8_8_ = 0;
  local_130 = 0;
  AddImport<flatbuffers::StructDef>
            (&local_370,local_3f0,(import_set *)local_378,(Definition *)parser,(StructDef *)parser);
  local_160._M_allocated_capacity = (size_type)&local_150;
  paVar24 = &local_370.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p == paVar24) {
    local_150._8_8_ = local_370.name.field_2._8_8_;
  }
  else {
    local_160._M_allocated_capacity = (size_type)local_370.name._M_dataplus._M_p;
  }
  local_150._M_allocated_capacity = local_370.name.field_2._M_allocated_capacity;
  local_160._8_8_ = local_370.name._M_string_length;
  local_370.name._M_string_length = 0;
  local_370.name.field_2._M_allocated_capacity =
       local_370.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_370.name._M_dataplus._M_p = (pointer)paVar24;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.object_name._M_dataplus._M_p != &local_370.object_name.field_2) {
    operator_delete(local_370.object_name._M_dataplus._M_p,
                    local_370.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.rel_file_path._M_dataplus._M_p != &local_370.rel_file_path.field_2) {
    operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                    local_370.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
    operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                    local_370.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
    operator_delete(local_370.export_statement._M_dataplus._M_p,
                    local_370.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
    operator_delete(local_370.import_statement._M_dataplus._M_p,
                    local_370.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_58 = obj_api_unpack_func;
  if (local_459 == false) {
    std::operator+(&local_2a0,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar24) {
      local_270._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_270._8_8_ = puVar11[3];
      local_280._M_allocated_capacity = (size_type)&local_270;
    }
    else {
      local_270._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_280._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar11;
    }
    local_280._8_8_ = puVar11[1];
    *puVar11 = paVar24;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::operator+(&local_210,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parser);
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_allocated_capacity != &local_270) {
      uVar18 = local_270._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_210._M_string_length + local_280._8_8_) {
      imports = (import_set *)&local_210.field_2;
      uVar23 = 0xf;
      if ((import_set *)local_210._M_dataplus._M_p != imports) {
        uVar23 = CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                          local_210.field_2._M_local_buf[0]);
      }
      if (uVar23 < local_210._M_string_length + local_280._8_8_) goto LAB_0024cfde;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_210,0,(char *)0x0,local_280._M_allocated_capacity);
    }
    else {
LAB_0024cfde:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          (local_280._M_local_buf,(ulong)local_210._M_dataplus._M_p);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258.field_2._8_8_ = puVar11[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_258._M_string_length = puVar11[1];
    *puVar11 = psVar12;
    puVar11[1] = 0;
    *(undefined1 *)psVar12 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    paVar24 = &local_370.name.field_2;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar20) {
      local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_370.name.field_2._8_8_ = puVar11[3];
      local_370.name._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = paVar20;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_140._M_local_buf,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != paVar24) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                               local_210.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_allocated_capacity != &local_270) {
      operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1);
    }
    uVar18 = local_2a0.field_2._M_allocated_capacity;
    _Var22._M_p = local_2a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) goto LAB_0024d378;
  }
  else {
    std::operator+(&local_210,"  return ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
    paVar24 = &local_2a0.field_2;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar20) {
      local_2a0.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2a0.field_2._8_8_ = plVar9[3];
      local_2a0._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2a0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a0._M_string_length = plVar9[1];
    *plVar9 = (long)paVar20;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::operator+(&local_1a0,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parser);
    uVar18 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar24) {
      uVar18 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < (char *)(local_1a0._M_string_length + local_2a0._M_string_length)) {
      imports = (import_set *)&local_1a0.field_2;
      pcVar19 = (char *)0xf;
      if ((import_set *)local_1a0._M_dataplus._M_p != imports) {
        pcVar19 = (char *)CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                   local_1a0.field_2._M_local_buf[0]);
      }
      if (pcVar19 < (char *)(local_1a0._M_string_length + local_2a0._M_string_length))
      goto LAB_0024cf35;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_1a0,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
    }
    else {
LAB_0024cf35:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2a0,(ulong)local_1a0._M_dataplus._M_p);
    }
    local_280._M_allocated_capacity = (size_type)&local_270;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar20) {
      local_270._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_270._8_8_ = puVar11[3];
    }
    else {
      local_270._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_280._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar11;
    }
    local_280._8_8_ = puVar11[1];
    *puVar11 = paVar20;
    puVar11[1] = 0;
    paVar20->_M_local_buf[0] = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::append(local_280._M_local_buf);
    psVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258.field_2._8_8_ = puVar11[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_258._M_string_length = puVar11[1];
    *puVar11 = psVar12;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    paVar20 = &local_370.name.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar14) {
      local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_370.name.field_2._8_8_ = puVar11[3];
      local_370.name._M_dataplus._M_p = (pointer)paVar20;
    }
    else {
      local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = paVar14;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_140._M_local_buf,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != paVar20) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_allocated_capacity != &local_270) {
      operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar24) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar18 = (char *)CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                local_210.field_2._M_local_buf[0]);
      _Var22._M_p = local_210._M_dataplus._M_p;
LAB_0024d378:
      operator_delete(_Var22._M_p,(ulong)(uVar18 + 1));
    }
  }
  if (*(char *)&(parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
      '\x01') {
    local_280._M_allocated_capacity = (size_type)&local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"this","");
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,",\n    ","");
    imports = (import_set *)0x0;
    GenStructMemberValueTS
              (&local_258,local_3f0,(StructDef *)parser,(string *)&local_280,&local_2a0,false);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar24) {
      local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_370.name.field_2._8_8_ = puVar11[3];
    }
    else {
      local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = paVar24;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append(local_140._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_allocated_capacity != &local_270) {
      operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1);
    }
  }
  p_Var25 = *(_Base_ptr *)&(parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8 = parser;
  if (p_Var25 != (parser->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    local_231 = local_459 ^ 1;
    local_1e8 = &local_370.object_name.field_2;
    local_1f0 = &local_370.rel_file_path.field_2;
    do {
      pIVar6 = local_380;
      pFVar3 = *(FieldDef **)p_Var25;
      if (pFVar3->deprecated != false) goto LAB_00253f25;
      local_260 = p_Var25;
      (*(local_380->super_Namer)._vptr_Namer[4])(&local_258,local_380,pFVar3);
      local_438 = pFVar3;
      (*(pIVar6->super_Namer)._vptr_Namer[0x12])(&local_280,pIVar6,pFVar3);
      std::operator+(&local_370.name,"this.",&local_258);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar24) {
        local_2a0.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_2a0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_2a0.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_2a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2a0._M_string_length = plVar9[1];
      *plVar9 = (long)paVar24;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      pFVar3 = local_438;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      local_1a0._M_string_length = 0;
      local_1a0.field_2._M_local_buf[0] = '\0';
      local_1c0._M_allocated_capacity = (size_type)&local_1b0;
      local_1c0._8_8_ = 0;
      local_1b0 = 0;
      local_120._M_allocated_capacity = (size_type)&local_110;
      local_120._8_8_ = 0;
      local_110._M_local_buf[0] = '\0';
      GenDefaultValue(&local_80,local_3f0,local_438,(import_set *)local_378);
      p_Var25 = local_260;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pFVar3->value;
      BVar1 = (pFVar3->value).type.base_type;
      if (BVar1 - BASE_TYPE_UTYPE < 0xd) {
        bVar26 = true;
        if (BVar1 != BASE_TYPE_STRING) {
          if (local_438->presence == kOptional) {
            iVar8 = std::__cxx11::string::compare((char *)&(local_438->value).constant);
            bVar26 = iVar8 == 0;
          }
          else {
            bVar26 = false;
          }
        }
        imports = (import_set *)0x0;
        GenTypeName(&local_370.name,local_3f0,(import_set *)local_378,&local_438->super_Definition,
                    (Type *)paVar24,false,bVar26);
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        (*(local_380->super_Namer)._vptr_Namer[4])(&local_3e8,local_380,local_438);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x365874);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_400._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_400._8_8_ = puVar11[3];
          local_410._M_allocated_capacity = (size_type)&local_400;
        }
        else {
          local_400._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_410._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
        paVar20 = &local_370.name.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar14) {
          local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = paVar14;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar20) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        if ((((Value *)paVar24)->type).base_type == BASE_TYPE_STRING) {
          (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_3e8,local_380,local_438);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x365874);
          local_410._M_allocated_capacity = (size_type)&local_400;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_400._8_8_ = puVar11[3];
          }
          else {
            local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_410._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_410._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::operator+(&local_520,"builder.createString(this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
          local_4a0._M_allocated_capacity = (size_type)&local_490;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"0","");
          GenNullCheckConditional
                    (&local_370.name,(string *)&local_410,(string *)&local_4a0,&local_500);
          std::__cxx11::string::operator=((string *)local_1c0._M_local_buf,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            (ulong)(local_490._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_allocated_capacity != &local_400) {
            operator_delete((void *)local_410._M_allocated_capacity,
                            (ulong)(local_400._M_allocated_capacity + 1));
          }
          uVar18 = local_3e8.field_2._M_allocated_capacity;
          uVar21 = local_3e8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
LAB_0024e3cd:
            operator_delete((void *)uVar21,(ulong)&((IDLOptions *)uVar18)->use_flexbuffers);
          }
        }
        else {
          (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_410,local_380,local_438);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x365874);
          paVar24 = &local_370.name.field_2;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar20) {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = paVar20;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_120._M_local_buf,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar24) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          uVar18 = local_400._M_allocated_capacity;
          uVar21 = local_410._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_allocated_capacity != &local_400) goto LAB_0024e3cd;
        }
        goto LAB_0025302b;
      }
      switch(BVar1) {
      case BASE_TYPE_VECTOR:
        BVar1 = (local_438->value).type.element;
        local_410._8_8_ = (local_438->value).type.struct_def;
        pIVar4 = (IDLOptions *)(local_438->value).type.enum_def;
        local_410._M_allocated_capacity._4_4_ = 0;
        local_410._M_allocated_capacity._0_4_ = BVar1;
        local_400._8_2_ = (local_438->value).type.fixed_length;
        imports = (import_set *)0x0;
        local_400._M_allocated_capacity = (size_type)pIVar4;
        GenTypeName(&local_3e8,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                    (Type *)&local_410,false,false);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_1a0,0,(char *)local_1a0._M_string_length,0x37f775);
        if (BVar1 == BASE_TYPE_STRING) {
          std::__cxx11::string::append((char *)&local_1a0);
          local_4e0 = &local_4d0;
          local_4d0._M_allocated_capacity = 0x2162622e73696874;
          local_4d8 = 8;
          local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          p_Var25 = local_260;
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = plVar9[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)paVar24;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Length","");
          IdlNamer::Field((string *)&local_480,local_380,local_438,&local_458);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar18 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_520._M_string_length)) {
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              uVar18 = local_470._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_520._M_string_length))
            goto LAB_0024f009;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_0024f009:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,local_480._M_allocated_capacity);
          }
          local_4a0._M_allocated_capacity = (size_type)&local_490;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
          paVar24 = &local_370.name.field_2;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar20) {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = paVar20;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar24) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            local_490._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            operator_delete((void *)local_480._M_allocated_capacity,
                            (ulong)(local_470._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                     (StructDef *)local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_470._8_8_ = puVar11[3];
            local_480._M_allocated_capacity = (size_type)&local_470;
          }
          else {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_480._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_480._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"create","");
          local_3c0 = &local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
          (*(local_380->super_Namer)._vptr_Namer[2])
                    (&local_458,local_380,&local_430,local_438,(string *)&local_3c0);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            uVar18 = local_470._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_)) {
            imports = (import_set *)&local_458.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_458._M_dataplus._M_p != imports) {
              uVar18 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_))
            goto LAB_002504d3;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,local_480._M_allocated_capacity);
          }
          else {
LAB_002504d3:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_480._M_local_buf,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = puVar11[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar17 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_3a0,local_380,local_438);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar18 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) {
            imports = (import_set *)&local_390;
            uVar18 = 0xf;
            if ((import_set *)local_3a0._0_8_ != imports) {
              uVar18 = local_390._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) goto LAB_0025185c;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_0025185c:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,local_3a0._0_8_);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)puVar16 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
          goto LAB_00251dce;
        }
        if (BVar1 != BASE_TYPE_STRUCT) {
          if (BVar1 == BASE_TYPE_UNION) {
            GenObjApiUnionTypeTS
                      (&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,
                       pIVar4,(EnumDef *)imports);
            std::__cxx11::string::_M_append
                      ((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            std::__cxx11::string::append((char *)&local_1a0);
            imports = (import_set *)&local_410;
            GenUnionValTS(&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,
                          &local_258,(Type *)imports,true);
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            AddImport<flatbuffers::StructDef>
                      (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                       (StructDef *)local_3c8);
            p_Var25 = local_260;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_470._8_8_ = puVar11[3];
              local_480._M_allocated_capacity = (size_type)&local_470;
            }
            else {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_480._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_480._8_8_ = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"create","");
            local_3c0 = &local_3b0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
            (*(local_380->super_Namer)._vptr_Namer[2])
                      (&local_458,local_380,&local_430,local_438,(string *)&local_3c0);
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              uVar18 = local_470._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_)) {
              imports = (import_set *)&local_458.field_2;
              uVar18 = (IDLOptions *)0xf;
              if ((import_set *)local_458._M_dataplus._M_p != imports) {
                uVar18 = local_458.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_))
              goto LAB_0024f3ec;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_458,0,(char *)0x0,local_480._M_allocated_capacity);
            }
            else {
LAB_0024f3ec:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_480._M_local_buf,(ulong)local_458._M_dataplus._M_p);
            }
            local_4e0 = &local_4d0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            paVar24->_M_local_buf[0] = '\0';
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4b0._8_8_ = puVar11[3];
            }
            else {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar17 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar17;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_3a0,local_380,local_438);
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              uVar18 = local_500.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) {
              imports = (import_set *)&local_390;
              uVar18 = 0xf;
              if ((import_set *)local_3a0._0_8_ != imports) {
                uVar18 = local_390._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) goto LAB_00250b49;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p
                                  );
            }
            else {
LAB_00250b49:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_500,local_3a0._0_8_);
            }
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar16 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar16;
            puVar11[1] = 0;
            *(undefined1 *)puVar16 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            goto LAB_00251dce;
          }
          if (pIVar4 == (IDLOptions *)0x0) {
            std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_3e8._M_dataplus._M_p);
          }
          else {
            if (local_438->presence == kOptional) {
              iVar8 = std::__cxx11::string::compare((char *)&(local_438->value).constant);
              bVar26 = iVar8 == 0;
            }
            else {
              bVar26 = false;
            }
            imports = (import_set *)0x0;
            GenTypeName(&local_370.name,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                        (Type *)&local_410,false,bVar26);
            std::__cxx11::string::_M_append
                      ((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
          }
          std::__cxx11::string::append((char *)&local_1a0);
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          local_458.field_2._M_allocated_capacity = 0x2162622e73696874;
          local_458._M_string_length = 8;
          local_458.field_2._8_8_ = local_458.field_2._8_8_ & 0xffffffffffffff00;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
          p_Var25 = local_260;
          local_480._M_allocated_capacity = (size_type)&local_470;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_470._8_8_ = puVar11[3];
          }
          else {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_480._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_480._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     (local_480._M_local_buf,(ulong)local_3e8._M_dataplus._M_p);
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = plVar9[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_4d8 = plVar9[1];
          *plVar9 = (long)paVar24;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = plVar9[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)paVar24;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_3c0 = &local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Length","");
          (*(local_380->super_Namer)._vptr_Namer[3])
                    (&local_430,local_380,local_438,(string *)&local_3c0);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar18 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 <
              (IDLOptions *)(local_430._M_string_length + local_520._M_string_length)) {
            imports = (import_set *)&local_430.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_430._M_dataplus._M_p != imports) {
              uVar18 = local_430.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 <
                (IDLOptions *)(local_430._M_string_length + local_520._M_string_length))
            goto LAB_0024fe32;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_430,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_0024fe32:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,(ulong)local_430._M_dataplus._M_p);
          }
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
            local_4a0._M_allocated_capacity = (size_type)&local_490;
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
          paVar24 = &local_370.name.field_2;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar20) {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = paVar20;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar24) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            local_490._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,
                            (ulong)(local_430.field_2._M_allocated_capacity + 1));
          }
          if (local_3c0 != &local_3b0) {
            operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            operator_delete((void *)local_480._M_allocated_capacity,
                            (ulong)(local_470._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                     (StructDef *)local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"create","");
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Vector","");
          (*(local_380->super_Namer)._vptr_Namer[2])
                    (&local_480,local_380,&local_458,local_438,&local_430);
          uVar18 = (IDLOptions *)0xf;
          if (local_4e0 != &local_4d0) {
            uVar18 = local_4d0._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_4d8)) {
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              uVar18 = local_470._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_4d8)) goto LAB_00250ec7;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_4e0);
          }
          else {
LAB_00250ec7:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_4e0,local_480._M_allocated_capacity);
          }
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = puVar11[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar17 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_500,local_280._M_allocated_capacity);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
LAB_00251b90:
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
            local_4a0._M_allocated_capacity = (size_type)&local_490;
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)local_1c0._M_local_buf,(string *)local_4a0._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            (ulong)(local_490._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            operator_delete((void *)local_480._M_allocated_capacity,
                            (ulong)(local_470._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,
                            (ulong)(local_430.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          uVar18 = local_4d0._M_allocated_capacity;
          uVar21 = local_4e0;
          if (local_4e0 != &local_4d0) goto LAB_00251f77;
          goto LAB_00251f7f;
        }
        pSVar5 = (local_438->value).type.struct_def;
        (*(local_3f0->namer_).super_Namer._vptr_Namer
          [(ulong)(((local_3f0->super_BaseGenerator).parser_)->opts).generate_object_based_api * 2 +
           0xf])(&local_4a0,local_380,pSVar5);
        std::__cxx11::string::_M_append((char *)&local_1a0,local_4a0._M_allocated_capacity);
        std::__cxx11::string::append((char *)&local_1a0);
        local_3a0._M_allocated_capacity = (size_type)&local_390;
        local_390._M_allocated_capacity = 0x2162622e73696874;
        local_3a0._8_8_ = 8;
        local_390._M_local_buf[8] = '\0';
        plVar9 = (long *)std::__cxx11::string::append(local_3a0._M_local_buf);
        local_3c0 = &local_3b0;
        pp_Var15 = (_Base_ptr *)(plVar9 + 2);
        if ((_Base_ptr *)*plVar9 == pp_Var15) {
          local_3b0 = *pp_Var15;
          lStack_3a8 = plVar9[3];
        }
        else {
          local_3b0 = *pp_Var15;
          local_3c0 = (_Base_ptr *)*plVar9;
        }
        local_3b8 = plVar9[1];
        *plVar9 = (long)pp_Var15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3c0,(ulong)local_3e8._M_dataplus._M_p);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_430.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_430.field_2._8_8_ = puVar11[3];
        }
        else {
          local_430.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_430._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_430._M_string_length = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_458.field_2._8_8_ = puVar11[3];
        }
        else {
          local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_458._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_458._M_string_length = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_458,local_4a0._M_allocated_capacity);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_470._8_8_ = puVar11[3];
          local_480._M_allocated_capacity = (size_type)&local_470;
        }
        else {
          local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_480._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_480._8_8_ = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append(local_480._M_local_buf);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar24) {
          local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4d0._8_8_ = plVar9[3];
          local_4e0 = &local_4d0;
        }
        else {
          local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9;
        }
        local_4d8 = plVar9[1];
        *plVar9 = (long)paVar24;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_4e0,(ulong)local_2a0._M_dataplus._M_p);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar24) {
          local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4b0._8_8_ = plVar9[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9;
        }
        local_4b8 = plVar9[1];
        *plVar9 = (long)paVar24;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        puVar17 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_500.field_2._M_allocated_capacity = *puVar17;
          local_500.field_2._8_8_ = plVar9[3];
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        }
        else {
          local_500.field_2._M_allocated_capacity = *puVar17;
          local_500._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_500._M_string_length = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_a0._M_allocated_capacity = (size_type)local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Length","");
        (*(local_380->super_Namer)._vptr_Namer[3])(&local_180,local_380,local_438,&local_a0);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          uVar18 = local_500.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_180._8_8_ + local_500._M_string_length) {
          imports = (import_set *)&local_170;
          uVar18 = 0xf;
          if ((import_set *)local_180._M_allocated_capacity != imports) {
            uVar18 = local_170._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_180._8_8_ + local_500._M_string_length) goto LAB_0024f7a7;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_180,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
        }
        else {
LAB_0024f7a7:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_500,local_180._M_allocated_capacity);
        }
        psVar12 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_520.field_2._M_allocated_capacity = *psVar12;
          local_520.field_2._8_8_ = puVar11[3];
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        }
        else {
          local_520.field_2._M_allocated_capacity = *psVar12;
          local_520._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_520._M_string_length = puVar11[1];
        *puVar11 = psVar12;
        puVar11[1] = 0;
        *(undefined1 *)psVar12 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        paVar24 = &local_370.name.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar24;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar24) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        pIVar6 = local_380;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_allocated_capacity != &local_170) {
          operator_delete((void *)local_180._M_allocated_capacity,
                          local_170._M_allocated_capacity + 1);
        }
        if ((EnumDef **)local_a0._M_allocated_capacity != local_90) {
          operator_delete((void *)local_a0._M_allocated_capacity,
                          (ulong)((long)&(local_90[0]->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_allocated_capacity != &local_470) {
          operator_delete((void *)local_480._M_allocated_capacity,
                          local_470._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          (ulong)(local_430.field_2._M_allocated_capacity + 1));
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._0_8_ != &local_390) {
          operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
        }
        if (pSVar5->fixed == true) {
          std::operator+(&local_458,"builder.createStructOffsetList(this.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_470._8_8_ = puVar11[3];
            local_480._M_allocated_capacity = (size_type)&local_470;
          }
          else {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_480._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_480._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          AddImport<flatbuffers::StructDef>
                    (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                     (StructDef *)local_3c8);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            uVar18 = local_470._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_370.name._M_string_length + local_480._8_8_)) {
            imports = (import_set *)&local_370.name.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_370.name._M_dataplus._M_p != imports) {
              uVar18 = local_370.name.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_370.name._M_string_length + local_480._8_8_))
            goto LAB_002522d7;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_370,0,(char *)0x0,local_480._M_allocated_capacity);
          }
          else {
LAB_002522d7:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_480._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = puVar11[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_3c0 = &local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"start","");
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Vector","");
          (*(pIVar6->super_Namer)._vptr_Namer[2])(&local_430,pIVar6,&local_3c0,local_438,&local_3a0)
          ;
          p_Var25 = local_260;
          uVar18 = (IDLOptions *)0xf;
          if (local_4c0 != &local_4b0) {
            uVar18 = local_4b0._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_430._M_string_length + local_4b8)) {
            imports = (import_set *)&local_430.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_430._M_dataplus._M_p != imports) {
              uVar18 = local_430.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_430._M_string_length + local_4b8))
            goto LAB_0025273f;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_430,0,(char *)0x0,(ulong)local_4c0);
          }
          else {
LAB_0025273f:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_4c0,(ulong)local_430._M_dataplus._M_p);
          }
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar17 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar17;
          puVar11[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          goto LAB_00252d84;
        }
        AddImport<flatbuffers::StructDef>
                  (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                   (StructDef *)local_3c8);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_458.field_2._8_8_ = puVar11[3];
        }
        else {
          local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_458._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_458._M_string_length = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_3c0 = &local_3b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"create","");
        local_3a0._M_allocated_capacity = (size_type)&local_390;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Vector","");
        (*(pIVar6->super_Namer)._vptr_Namer[2])(&local_430,pIVar6,&local_3c0,local_438,&local_3a0);
        p_Var25 = local_260;
        uVar18 = (IDLOptions *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          uVar18 = local_458.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < (IDLOptions *)(local_430._M_string_length + local_458._M_string_length))
        {
          imports = (import_set *)&local_430.field_2;
          uVar18 = (IDLOptions *)0xf;
          if ((import_set *)local_430._M_dataplus._M_p != imports) {
            uVar18 = local_430.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 <
              (IDLOptions *)(local_430._M_string_length + local_458._M_string_length))
          goto LAB_002523fc;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_430,0,(char *)0x0,(ulong)local_458._M_dataplus._M_p);
        }
        else {
LAB_002523fc:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_458,(ulong)local_430._M_dataplus._M_p);
        }
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_470._8_8_ = puVar11[3];
          local_480._M_allocated_capacity = (size_type)&local_470;
        }
        else {
          local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_480._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_480._8_8_ = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        paVar24->_M_local_buf[0] = '\0';
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_480._M_local_buf);
        local_4e0 = &local_4d0;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4d0._8_8_ = puVar11[3];
        }
        else {
          local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11;
        }
        local_4d8 = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        local_4c0 = &local_4b0;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4b0._8_8_ = puVar11[3];
        }
        else {
          local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11;
        }
        local_4b8 = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_4c0,local_280._M_allocated_capacity);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        puVar17 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_500.field_2._M_allocated_capacity = *puVar17;
          local_500.field_2._8_8_ = puVar11[3];
        }
        else {
          local_500.field_2._M_allocated_capacity = *puVar17;
          local_500._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_500._M_string_length = puVar11[1];
        *puVar11 = puVar17;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
LAB_00252a59:
        puVar16 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_520.field_2._M_allocated_capacity = *puVar16;
          local_520.field_2._8_8_ = puVar11[3];
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        }
        else {
          local_520.field_2._M_allocated_capacity = *puVar16;
          local_520._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_520._M_string_length = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1c0._M_local_buf,(string *)&local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,(ulong)(local_4b0._M_allocated_capacity + 1));
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_allocated_capacity != &local_470) {
          operator_delete((void *)local_480._M_allocated_capacity,
                          (ulong)(local_470._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          (ulong)(local_430.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._0_8_ != &local_390) {
          operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        uVar18 = local_370.name.field_2._M_allocated_capacity;
        _Var22._M_p = local_370.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) goto LAB_00252fca;
LAB_00252fd2:
        uVar18 = local_490._M_allocated_capacity;
        uVar21 = local_4a0._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_allocated_capacity != &local_490) goto LAB_00252fef;
        goto LAB_00252ff7;
      case BASE_TYPE_STRUCT:
        pSVar5 = (local_438->value).type.struct_def;
        AddImport<flatbuffers::StructDef>
                  (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,pSVar5);
        std::__cxx11::string::_M_append
                  ((char *)&local_1a0,(ulong)local_370.object_name._M_dataplus._M_p);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)imports;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)imports;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        (*(local_380->super_Namer)._vptr_Namer[4])(&local_3e8,local_380,local_438);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x365874);
        local_410._M_allocated_capacity = (size_type)&local_400;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_400._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_400._8_8_ = puVar11[3];
        }
        else {
          local_400._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_410._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
        local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name.field_2._8_8_ = puVar11[3];
        }
        else {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_370.name._M_dataplus._M_p,
                   local_370.name._M_dataplus._M_p + local_370.name._M_string_length);
        std::__cxx11::string::append((char *)&local_3e8);
        local_4a0._M_allocated_capacity = (size_type)&local_490;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"null","");
        GenNullCheckConditional
                  ((string *)&local_410,&local_370.name,&local_3e8,(string *)&local_4a0);
        std::__cxx11::string::operator=((string *)&local_210,(string *)local_410._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_allocated_capacity != &local_490) {
          operator_delete((void *)local_4a0._M_allocated_capacity,
                          (ulong)(local_490._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_3e8,"this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280);
        std::operator+(&local_520,"this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        local_4a0._M_allocated_capacity = (size_type)&local_490;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_490._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_490._8_8_ = puVar11[3];
        }
        else {
          local_490._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_4a0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_4a0._8_8_ = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"0","");
        p_Var25 = local_260;
        GenNullCheckConditional((string *)&local_410,&local_3e8,(string *)&local_4a0,&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_allocated_capacity != &local_490) {
          operator_delete((void *)local_4a0._M_allocated_capacity,
                          (ulong)(local_490._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        paVar20 = &local_120;
        if (pSVar5->fixed == false) {
          paVar20 = &local_1c0;
        }
        std::__cxx11::string::operator=
                  ((string *)paVar20->_M_local_buf,(string *)local_410._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        uVar18 = local_370.name.field_2._M_allocated_capacity;
        uVar21 = local_370.name._M_dataplus._M_p;
        imports = (import_set *)paVar24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
LAB_0024e814:
          operator_delete((void *)uVar21,(ulong)&((IDLOptions *)uVar18)->use_flexbuffers);
          imports = (import_set *)paVar24;
        }
        break;
      case BASE_TYPE_UNION:
        GenObjApiUnionTypeTS
                  (&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,
                   (IDLOptions *)(local_438->value).type.enum_def,(EnumDef *)imports);
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p);
        p_Var25 = local_260;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        GenUnionValTS(&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,
                      &local_258,(Type *)paVar24,false);
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_410,"builder.createObjectOffset(this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
        paVar20 = &local_370.name.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar14) {
          local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = paVar14;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1c0._M_local_buf,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar20) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        uVar18 = local_400._M_allocated_capacity;
        uVar21 = local_410._M_allocated_capacity;
        imports = (import_set *)paVar24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) goto LAB_0024e814;
        break;
      case BASE_TYPE_ARRAY:
        BVar1 = (local_438->value).type.element;
        local_410._8_8_ = (local_438->value).type.struct_def;
        pIVar4 = (IDLOptions *)(local_438->value).type.enum_def;
        local_410._M_allocated_capacity._4_4_ = 0;
        local_410._M_allocated_capacity._0_4_ = BVar1;
        local_400._8_2_ = (local_438->value).type.fixed_length;
        imports = (import_set *)0x0;
        local_400._M_allocated_capacity = (size_type)pIVar4;
        GenTypeName(&local_3e8,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                    (Type *)&local_410,false,false);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_1a0,0,(char *)local_1a0._M_string_length,0x37f775);
        if (BVar1 == BASE_TYPE_STRING) {
          std::__cxx11::string::append((char *)&local_1a0);
          local_4e0 = &local_4d0;
          local_4d0._M_allocated_capacity = 0x2162622e73696874;
          local_4d8 = 8;
          local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          p_Var25 = local_260;
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = plVar9[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)paVar24;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Length","");
          IdlNamer::Field((string *)&local_480,local_380,local_438,&local_458);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar18 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_520._M_string_length)) {
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              uVar18 = local_470._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_520._M_string_length))
            goto LAB_0024ef3c;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_0024ef3c:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,local_480._M_allocated_capacity);
          }
          local_4a0._M_allocated_capacity = (size_type)&local_490;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
          paVar24 = &local_370.name.field_2;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar20) {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = paVar20;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar24) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            local_490._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            operator_delete((void *)local_480._M_allocated_capacity,
                            (ulong)(local_470._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                     (StructDef *)local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_470._8_8_ = puVar11[3];
            local_480._M_allocated_capacity = (size_type)&local_470;
          }
          else {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_480._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_480._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"create","");
          local_3c0 = &local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
          (*(local_380->super_Namer)._vptr_Namer[2])
                    (&local_458,local_380,&local_430,local_438,(string *)&local_3c0);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            uVar18 = local_470._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_)) {
            imports = (import_set *)&local_458.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_458._M_dataplus._M_p != imports) {
              uVar18 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_))
            goto LAB_00250181;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,local_480._M_allocated_capacity);
          }
          else {
LAB_00250181:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_480._M_local_buf,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = puVar11[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar17 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_3a0,local_380,local_438);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar18 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) {
            imports = (import_set *)&local_390;
            uVar18 = 0xf;
            if ((import_set *)local_3a0._0_8_ != imports) {
              uVar18 = local_390._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) goto LAB_002516cf;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_002516cf:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,local_3a0._0_8_);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)puVar16 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        }
        else {
          if (BVar1 == BASE_TYPE_STRUCT) {
            pSVar5 = (local_438->value).type.struct_def;
            (*(local_3f0->namer_).super_Namer._vptr_Namer
              [(ulong)(((local_3f0->super_BaseGenerator).parser_)->opts).generate_object_based_api *
               2 + 0xf])(&local_4a0,local_380,pSVar5);
            std::__cxx11::string::_M_append((char *)&local_1a0,local_4a0._M_allocated_capacity);
            std::__cxx11::string::append((char *)&local_1a0);
            local_3a0._M_allocated_capacity = (size_type)&local_390;
            local_390._M_allocated_capacity = 0x2162622e73696874;
            local_3a0._8_8_ = 8;
            local_390._M_local_buf[8] = '\0';
            plVar9 = (long *)std::__cxx11::string::append(local_3a0._M_local_buf);
            local_3c0 = &local_3b0;
            pp_Var15 = (_Base_ptr *)(plVar9 + 2);
            if ((_Base_ptr *)*plVar9 == pp_Var15) {
              local_3b0 = *pp_Var15;
              lStack_3a8 = plVar9[3];
            }
            else {
              local_3b0 = *pp_Var15;
              local_3c0 = (_Base_ptr *)*plVar9;
            }
            local_3b8 = plVar9[1];
            *plVar9 = (long)pp_Var15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_3c0,(ulong)local_3e8._M_dataplus._M_p);
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_430.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_430.field_2._8_8_ = puVar11[3];
            }
            else {
              local_430.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_430._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_430._M_string_length = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_458.field_2._8_8_ = puVar11[3];
            }
            else {
              local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_458._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_458._M_string_length = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_458,local_4a0._M_allocated_capacity);
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_470._8_8_ = puVar11[3];
              local_480._M_allocated_capacity = (size_type)&local_470;
            }
            else {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_480._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_480._8_8_ = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append(local_480._M_local_buf);
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar24) {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4d0._8_8_ = plVar9[3];
              local_4e0 = &local_4d0;
            }
            else {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4d8 = plVar9[1];
            *plVar9 = (long)paVar24;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_4e0,(ulong)local_2a0._M_dataplus._M_p);
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar24) {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4b0._8_8_ = plVar9[3];
              local_4c0 = &local_4b0;
            }
            else {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4b8 = plVar9[1];
            *plVar9 = (long)paVar24;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_4c0);
            puVar17 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500.field_2._8_8_ = plVar9[3];
              local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_500._M_string_length = plVar9[1];
            *plVar9 = (long)puVar17;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            NumToString<unsigned_short>((string *)&local_180,(local_438->value).type.fixed_length);
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              uVar18 = local_500.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_180._8_8_ + local_500._M_string_length) {
              imports = (import_set *)&local_170;
              uVar18 = 0xf;
              if ((import_set *)local_180._M_allocated_capacity != imports) {
                uVar18 = local_170._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_180._8_8_ + local_500._M_string_length) goto LAB_0024f6d7;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_180,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p
                                  );
            }
            else {
LAB_0024f6d7:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_500,local_180._M_allocated_capacity);
            }
            psVar12 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_520.field_2._M_allocated_capacity = *psVar12;
              local_520.field_2._8_8_ = puVar11[3];
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            }
            else {
              local_520.field_2._M_allocated_capacity = *psVar12;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = psVar12;
            puVar11[1] = 0;
            *(undefined1 *)psVar12 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            paVar24 = &local_370.name.field_2;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar20) {
              local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_370.name.field_2._8_8_ = puVar11[3];
              local_370.name._M_dataplus._M_p = (pointer)paVar24;
            }
            else {
              local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = paVar20;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != paVar24) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1
                             );
            }
            pIVar6 = local_380;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_allocated_capacity != &local_170) {
              operator_delete((void *)local_180._M_allocated_capacity,
                              local_170._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              operator_delete((void *)local_480._M_allocated_capacity,
                              local_470._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,
                              (ulong)(local_458.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,
                              (ulong)(local_430.field_2._M_allocated_capacity + 1));
            }
            if (local_3c0 != &local_3b0) {
              operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._0_8_ != &local_390) {
              operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
            }
            if (pSVar5->fixed != true) {
              AddImport<flatbuffers::StructDef>
                        (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                         (StructDef *)local_3c8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
              local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
              paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar24) {
                local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_458.field_2._8_8_ = puVar11[3];
              }
              else {
                local_458.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_458._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_458._M_string_length = puVar11[1];
              *puVar11 = paVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              local_3c0 = &local_3b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"create","");
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Vector","");
              (*(pIVar6->super_Namer)._vptr_Namer[2])
                        (&local_430,pIVar6,&local_3c0,local_438,&local_3a0);
              p_Var25 = local_260;
              uVar18 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != &local_458.field_2) {
                uVar18 = local_458.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 <
                  (IDLOptions *)(local_430._M_string_length + local_458._M_string_length)) {
                imports = (import_set *)&local_430.field_2;
                uVar18 = (IDLOptions *)0xf;
                if ((import_set *)local_430._M_dataplus._M_p != imports) {
                  uVar18 = local_430.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 <
                    (IDLOptions *)(local_430._M_string_length + local_458._M_string_length))
                goto LAB_00252221;
                puVar11 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_430,0,(char *)0x0,
                                     (ulong)local_458._M_dataplus._M_p);
              }
              else {
LAB_00252221:
                puVar11 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_458,(ulong)local_430._M_dataplus._M_p);
              }
              paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar24) {
                local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_470._8_8_ = puVar11[3];
                local_480._M_allocated_capacity = (size_type)&local_470;
              }
              else {
                local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_480._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar11;
              }
              local_480._8_8_ = puVar11[1];
              *puVar11 = paVar24;
              puVar11[1] = 0;
              paVar24->_M_local_buf[0] = '\0';
              puVar11 = (undefined8 *)std::__cxx11::string::append(local_480._M_local_buf);
              local_4e0 = &local_4d0;
              paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar24) {
                local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_4d0._8_8_ = puVar11[3];
              }
              else {
                local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar11;
              }
              local_4d8 = puVar11[1];
              *puVar11 = paVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
              local_4c0 = &local_4b0;
              paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar24) {
                local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_4b0._8_8_ = puVar11[3];
              }
              else {
                local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
                local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar11;
              }
              local_4b8 = puVar11[1];
              *puVar11 = paVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4c0,local_280._M_allocated_capacity);
              local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
              puVar17 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar17) {
                local_500.field_2._M_allocated_capacity = *puVar17;
                local_500.field_2._8_8_ = puVar11[3];
              }
              else {
                local_500.field_2._M_allocated_capacity = *puVar17;
                local_500._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_500._M_string_length = puVar11[1];
              *puVar11 = puVar17;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
              goto LAB_00252a59;
            }
            std::operator+(&local_458,"builder.createStructOffsetList(this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_280);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_470._8_8_ = puVar11[3];
              local_480._M_allocated_capacity = (size_type)&local_470;
            }
            else {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_480._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_480._8_8_ = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            AddImport<flatbuffers::StructDef>
                      (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                       (StructDef *)local_3c8);
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              uVar18 = local_470._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_370.name._M_string_length + local_480._8_8_)) {
              imports = (import_set *)&local_370.name.field_2;
              uVar18 = (IDLOptions *)0xf;
              if ((import_set *)local_370.name._M_dataplus._M_p != imports) {
                uVar18 = local_370.name.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < (IDLOptions *)(local_370.name._M_string_length + local_480._8_8_))
              goto LAB_002520fc;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_370,0,(char *)0x0,local_480._M_allocated_capacity);
            }
            else {
LAB_002520fc:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_480._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
            }
            local_4e0 = &local_4d0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            paVar24->_M_local_buf[0] = '\0';
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4b0._8_8_ = puVar11[3];
            }
            else {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_3c0 = &local_3b0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"start","");
            local_3a0._M_allocated_capacity = (size_type)&local_390;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Vector","");
            (*(pIVar6->super_Namer)._vptr_Namer[2])
                      (&local_430,pIVar6,&local_3c0,local_438,&local_3a0);
            p_Var25 = local_260;
            uVar18 = (IDLOptions *)0xf;
            if (local_4c0 != &local_4b0) {
              uVar18 = local_4b0._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_430._M_string_length + local_4b8)) {
              imports = (import_set *)&local_430.field_2;
              uVar18 = (IDLOptions *)0xf;
              if ((import_set *)local_430._M_dataplus._M_p != imports) {
                uVar18 = local_430.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < (IDLOptions *)(local_430._M_string_length + local_4b8))
              goto LAB_0025259f;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_430,0,(char *)0x0,(ulong)local_4c0);
            }
            else {
LAB_0025259f:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4c0,(ulong)local_430._M_dataplus._M_p);
            }
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar17 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar17;
            puVar11[1] = 0;
            *(undefined1 *)puVar17 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
LAB_00252d84:
            puVar16 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520.field_2._8_8_ = puVar11[3];
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar16;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1c0._M_local_buf,(string *)&local_520);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,
                              (ulong)(local_520.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,
                              (ulong)(local_430.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._0_8_ != &local_390) {
              operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
            }
            if (local_3c0 != &local_3b0) {
              operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,(ulong)(local_4b0._M_allocated_capacity + 1));
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.object_name._M_dataplus._M_p != local_1e8) {
              operator_delete(local_370.object_name._M_dataplus._M_p,
                              local_370.object_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
              operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                              local_370.rel_file_path.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
              operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                              local_370.bare_file_path.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.export_statement._M_dataplus._M_p !=
                &local_370.export_statement.field_2) {
              operator_delete(local_370.export_statement._M_dataplus._M_p,
                              local_370.export_statement.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.import_statement._M_dataplus._M_p !=
                &local_370.import_statement.field_2) {
              operator_delete(local_370.import_statement._M_dataplus._M_p,
                              local_370.import_statement.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              operator_delete((void *)local_480._M_allocated_capacity,
                              (ulong)(local_470._M_allocated_capacity + 1));
            }
            uVar18 = local_458.field_2._M_allocated_capacity;
            _Var22._M_p = local_458._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
LAB_00252fca:
              operator_delete(_Var22._M_p,(ulong)&((IDLOptions *)uVar18)->use_flexbuffers);
            }
            goto LAB_00252fd2;
          }
          if (BVar1 != BASE_TYPE_UNION) {
            if (pIVar4 == (IDLOptions *)0x0) {
              std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_3e8._M_dataplus._M_p);
            }
            else {
              if (local_438->presence == kOptional) {
                iVar8 = std::__cxx11::string::compare((char *)&(local_438->value).constant);
                bVar26 = iVar8 == 0;
              }
              else {
                bVar26 = false;
              }
              imports = (import_set *)0x0;
              GenTypeName(&local_370.name,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                          (Type *)&local_410,false,bVar26);
              std::__cxx11::string::_M_append
                        ((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
                operator_delete(local_370.name._M_dataplus._M_p,
                                (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
              }
            }
            std::__cxx11::string::append((char *)&local_1a0);
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            local_458.field_2._M_allocated_capacity = 0x2162622e73696874;
            local_458._M_string_length = 8;
            local_458.field_2._8_8_ = local_458.field_2._8_8_ & 0xffffffffffffff00;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
            p_Var25 = local_260;
            local_480._M_allocated_capacity = (size_type)&local_470;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_470._8_8_ = puVar11[3];
            }
            else {
              local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_480._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_480._8_8_ = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       (local_480._M_local_buf,(ulong)local_3e8._M_dataplus._M_p);
            local_4e0 = &local_4d0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar24) {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4d0._8_8_ = plVar9[3];
            }
            else {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4d8 = plVar9[1];
            *plVar9 = (long)paVar24;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar24) {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4b0._8_8_ = plVar9[3];
            }
            else {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4b8 = plVar9[1];
            *plVar9 = (long)paVar24;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_500.field_2._M_allocated_capacity = *psVar12;
              local_500.field_2._8_8_ = plVar9[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *psVar12;
              local_500._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_500._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar16 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar16;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            NumToString<unsigned_short>(&local_430,(local_438->value).type.fixed_length);
            uVar18 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              uVar18 = local_520.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 <
                (IDLOptions *)(local_430._M_string_length + local_520._M_string_length)) {
              imports = (import_set *)&local_430.field_2;
              uVar18 = (IDLOptions *)0xf;
              if ((import_set *)local_430._M_dataplus._M_p != imports) {
                uVar18 = local_430.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 <
                  (IDLOptions *)(local_430._M_string_length + local_520._M_string_length))
              goto LAB_0024fad3;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_430,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p
                                  );
            }
            else {
LAB_0024fad3:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_520,(ulong)local_430._M_dataplus._M_p);
            }
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_490._8_8_ = puVar11[3];
              local_4a0._M_allocated_capacity = (size_type)&local_490;
            }
            else {
              local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4a0._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_4a0._8_8_ = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            paVar24->_M_local_buf[0] = '\0';
            puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
            paVar24 = &local_370.name.field_2;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar20) {
              local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_370.name.field_2._8_8_ = puVar11[3];
              local_370.name._M_dataplus._M_p = (pointer)paVar24;
            }
            else {
              local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = paVar20;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != paVar24) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_allocated_capacity != &local_490) {
              operator_delete((void *)local_4a0._M_allocated_capacity,
                              local_490._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,
                              (ulong)(local_430.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,
                              (ulong)(local_520.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,local_4b0._M_allocated_capacity + 1);
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
              operator_delete((void *)local_480._M_allocated_capacity,
                              (ulong)(local_470._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,
                              (ulong)(local_458.field_2._M_allocated_capacity + 1));
            }
            AddImport<flatbuffers::StructDef>
                      (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                       (StructDef *)local_3c8);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
            local_4e0 = &local_4d0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"create","");
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Vector","");
            (*(local_380->super_Namer)._vptr_Namer[2])
                      (&local_480,local_380,&local_458,local_438,&local_430);
            uVar18 = (IDLOptions *)0xf;
            if (local_4e0 != &local_4d0) {
              uVar18 = local_4d0._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_4d8)) {
              uVar18 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_allocated_capacity != &local_470) {
                uVar18 = local_470._M_allocated_capacity;
              }
              if ((ulong)uVar18 < (IDLOptions *)(local_480._8_8_ + local_4d8)) goto LAB_0025082f;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_480,0,(char *)0x0,(ulong)local_4e0);
            }
            else {
LAB_0025082f:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4e0,local_480._M_allocated_capacity);
            }
            local_4c0 = &local_4b0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4b0._8_8_ = puVar11[3];
            }
            else {
              local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            paVar24->_M_local_buf[0] = '\0';
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar17 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar17;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar17;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_500,local_280._M_allocated_capacity);
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar16 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar16;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar16;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            goto LAB_00251b90;
          }
          GenObjApiUnionTypeTS
                    (&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,pIVar4
                     ,(EnumDef *)imports);
          std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_370.name._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)&local_1a0);
          imports = (import_set *)&local_410;
          GenUnionValTS(&local_370.name,local_3f0,(import_set *)local_378,(StructDef *)local_3c8,
                        &local_258,(Type *)imports,true);
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,local_3f0,(import_set *)local_378,(Definition *)local_3c8,
                     (StructDef *)local_3c8);
          p_Var25 = local_260;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_470._8_8_ = puVar11[3];
            local_480._M_allocated_capacity = (size_type)&local_470;
          }
          else {
            local_470._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_480._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_480._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"create","");
          local_3c0 = &local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
          (*(local_380->super_Namer)._vptr_Namer[2])
                    (&local_458,local_380,&local_430,local_438,(string *)&local_3c0);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_allocated_capacity != &local_470) {
            uVar18 = local_470._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_)) {
            imports = (import_set *)&local_458.field_2;
            uVar18 = (IDLOptions *)0xf;
            if ((import_set *)local_458._M_dataplus._M_p != imports) {
              uVar18 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_458._M_string_length + local_480._8_8_))
            goto LAB_0024f2d7;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,local_480._M_allocated_capacity);
          }
          else {
LAB_0024f2d7:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_480._M_local_buf,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4b0._8_8_ = puVar11[3];
          }
          else {
            local_4b0._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar17 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar17;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (*(local_380->super_Namer)._vptr_Namer[0x12])(&local_3a0,local_380,local_438);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar18 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) {
            imports = (import_set *)&local_390;
            uVar18 = 0xf;
            if ((import_set *)local_3a0._0_8_ != imports) {
              uVar18 = local_390._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_3a0._8_8_ + local_500._M_string_length) goto LAB_002509bc;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_002509bc:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,local_3a0._0_8_);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)puVar16 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        }
LAB_00251dce:
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_490._8_8_ = puVar11[3];
          local_4a0._M_allocated_capacity = (size_type)&local_490;
        }
        else {
          local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_4a0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_4a0._8_8_ = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)local_1c0._M_local_buf,(string *)local_4a0._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_allocated_capacity != &local_490) {
          operator_delete((void *)local_4a0._M_allocated_capacity,
                          (ulong)(local_490._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._0_8_ != &local_390) {
          operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,(ulong)(local_4b0._M_allocated_capacity + 1));
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,(ulong)((long)&local_3b0->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          (ulong)(local_430.field_2._M_allocated_capacity + 1));
        }
        uVar18 = local_470._M_allocated_capacity;
        uVar21 = local_480._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_allocated_capacity != &local_470) {
LAB_00251f77:
          operator_delete((void *)uVar21,(ulong)&((IDLOptions *)uVar18)->use_flexbuffers);
        }
LAB_00251f7f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        uVar18 = local_370.name.field_2._M_allocated_capacity;
        uVar21 = local_370.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
LAB_00252fef:
          operator_delete((void *)uVar21,(ulong)&((IDLOptions *)uVar18)->use_flexbuffers);
        }
LAB_00252ff7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                      ,0x5ac,
                      "void flatbuffers::ts::TsGenerator::GenObjApi(const Parser &, StructDef &, std::string &, std::string &, import_set &)"
                     );
      }
      std::__cxx11::string::append((char *)&local_1a0);
LAB_0025302b:
      if (local_1c0._8_8_ != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4a0,"  const ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_3e8.field_2._8_8_ = puVar11[3];
        }
        else {
          local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_3e8._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_3e8._M_string_length = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3e8,local_1c0._M_allocated_capacity);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar24) {
          local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_400._8_8_ = puVar11[3];
          local_410._M_allocated_capacity = (size_type)&local_400;
        }
        else {
          local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_410._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
        paVar24 = &local_370.name.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar20) {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar24;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = paVar20;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1c0._M_local_buf,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar24) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_allocated_capacity != &local_400) {
          operator_delete((void *)local_410._M_allocated_capacity,
                          (ulong)(local_400._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_allocated_capacity != &local_490) {
          operator_delete((void *)local_4a0._M_allocated_capacity,
                          (ulong)(local_490._M_allocated_capacity + 1));
        }
      }
      if (local_120._8_8_ == 0) {
        std::__cxx11::string::_M_assign((string *)local_120._M_local_buf);
      }
      std::operator+(&local_370.name,"    ",&local_210);
      std::__cxx11::string::_M_append(local_e0._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4a0
                     ,"  _o.",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_280);
      plVar9 = (long *)std::__cxx11::string::append(local_4a0._M_local_buf);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3e8.field_2._M_allocated_capacity = *psVar12;
        local_3e8.field_2._8_8_ = plVar9[3];
      }
      else {
        local_3e8.field_2._M_allocated_capacity = *psVar12;
        local_3e8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3e8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3e8,(ulong)local_210._M_dataplus._M_p);
      local_410._M_allocated_capacity = (size_type)&local_400;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar24) {
        local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_400._8_8_ = plVar9[3];
      }
      else {
        local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_410._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_410._8_8_ = plVar9[1];
      *plVar9 = (long)paVar24;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_410._M_local_buf);
      local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_370.name.field_2._M_allocated_capacity = *psVar12;
        local_370.name.field_2._8_8_ = plVar9[3];
      }
      else {
        local_370.name.field_2._M_allocated_capacity = *psVar12;
        local_370.name._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_370.name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        local_370.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_allocated_capacity != &local_400) {
        operator_delete((void *)local_410._M_allocated_capacity,local_400._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_allocated_capacity != &local_490) {
        operator_delete((void *)local_4a0._M_allocated_capacity,
                        (ulong)(local_490._M_allocated_capacity + 1));
      }
      std::operator+(&local_520,"  public ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                    );
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
      local_4a0._M_allocated_capacity = (size_type)&local_490;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar24) {
        local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_490._8_8_ = puVar11[3];
      }
      else {
        local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_4a0._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_4a0._8_8_ = puVar11[1];
      *puVar11 = paVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          (local_4a0._M_local_buf,(ulong)local_1a0._M_dataplus._M_p);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar24) {
        local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_3e8.field_2._8_8_ = puVar11[3];
      }
      else {
        local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_3e8._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_3e8._M_string_length = puVar11[1];
      *puVar11 = paVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      local_410._M_allocated_capacity = (size_type)&local_400;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar24) {
        local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_400._8_8_ = puVar11[3];
      }
      else {
        local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_410._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_410._8_8_ = puVar11[1];
      *puVar11 = paVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          (local_410._M_local_buf,(ulong)local_80._M_dataplus._M_p);
      local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar24) {
        local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_370.name.field_2._8_8_ = puVar11[3];
      }
      else {
        local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_370.name._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_370.name._M_string_length = puVar11[1];
      *puVar11 = paVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_allocated_capacity != &local_400) {
        operator_delete((void *)local_410._M_allocated_capacity,
                        (ulong)(local_400._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,
                        (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_allocated_capacity != &local_490) {
        operator_delete((void *)local_4a0._M_allocated_capacity,
                        (ulong)(local_490._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,
                        (ulong)(local_520.field_2._M_allocated_capacity + 1));
      }
      if (*(char *)&(local_3c8->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right
          == '\0') {
        if (local_1c0._8_8_ != 0) {
          local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_370,local_1c0._M_allocated_capacity,
                     (undefined1 *)(local_1c0._8_8_ + local_1c0._M_allocated_capacity));
          std::__cxx11::string::append((char *)&local_370);
          std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_370.name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
        }
        if (local_459 == false) {
          if (((local_438->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
             (local_438->presence == kOptional)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_410,"  if (",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_120);
            puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
            local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar24) {
              local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_370.name.field_2._8_8_ = puVar11[3];
            }
            else {
              local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = paVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      (local_140._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_allocated_capacity != &local_400) {
              operator_delete((void *)local_410._M_allocated_capacity,
                              (ulong)(local_400._M_allocated_capacity + 1));
            }
          }
          std::operator+(&local_500,"  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar16 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar16;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar16;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_4e0 = &local_4d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"add","");
          (*(local_380->super_Namer)._vptr_Namer[3])
                    (&local_4c0,local_380,(string *)&local_4e0,local_438);
          uVar18 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar18 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < (IDLOptions *)(local_4b8 + local_520._M_string_length)) {
            imports = (import_set *)&local_4b0;
            uVar18 = (IDLOptions *)0xf;
            if (local_4c0 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)imports) {
              uVar18 = local_4b0._M_allocated_capacity;
            }
            if ((ulong)uVar18 < (IDLOptions *)(local_4b8 + local_520._M_string_length))
            goto LAB_00253a32;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_00253a32:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_4c0);
          }
          local_4a0._M_allocated_capacity = (size_type)&local_490;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_490._8_8_ = puVar11[3];
          }
          else {
            local_490._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_4a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_4a0._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          paVar24->_M_local_buf[0] = '\0';
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_4a0._M_local_buf);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_3e8.field_2._8_8_ = puVar11[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_3e8._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_3e8._M_string_length = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_3e8,local_120._M_allocated_capacity);
          local_410._M_allocated_capacity = (size_type)&local_400;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_400._8_8_ = puVar11[3];
          }
          else {
            local_400._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_410._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_410._8_8_ = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_410._M_local_buf);
          local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 == paVar24) {
            local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_370.name.field_2._8_8_ = puVar11[3];
          }
          else {
            local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = paVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append
                    (local_140._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_allocated_capacity != &local_400) {
            operator_delete((void *)local_410._M_allocated_capacity,
                            (ulong)(local_400._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,
                            (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_allocated_capacity != &local_490) {
            operator_delete((void *)local_4a0._M_allocated_capacity,
                            (ulong)(local_490._M_allocated_capacity + 1));
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append(local_140._M_local_buf,local_120._M_allocated_capacity);
        }
      }
      if ((_Base_ptr)&p_Var25->_M_parent ==
          (local_3c8->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        std::__cxx11::string::append((char *)&local_230);
        if (*(char *)&(local_3c8->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right
            == '\0') {
          std::__cxx11::string::append((char *)&local_c0);
          std::__cxx11::string::append(local_140._M_local_buf);
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_230);
        if (*(char *)&(local_3c8->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right
            == '\0' && local_231 == 0) {
          std::__cxx11::string::append(local_140._M_local_buf);
        }
      }
      std::__cxx11::string::append(local_e0._M_local_buf);
      std::__cxx11::string::append((char *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_allocated_capacity != &local_110) {
        operator_delete((void *)local_120._M_allocated_capacity,
                        CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_1c0._M_allocated_capacity != &local_1b0) {
        operator_delete((void *)local_1c0._M_allocated_capacity,CONCAT71(uStack_1af,local_1b0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,
                        CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                 local_1a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_allocated_capacity != &local_270) {
        operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
LAB_00253f25:
      p_Var25 = (_Base_ptr)&p_Var25->_M_parent;
    } while (p_Var25 !=
             (local_3c8->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  std::__cxx11::string::append((char *)&local_230);
  psVar7 = local_58;
  pIVar6 = local_380;
  __rhs = local_3c8;
  if (local_459 != false) {
    std::__cxx11::string::append(local_140._M_local_buf);
    goto LAB_0025421e;
  }
  std::operator+(&local_2a0,"return ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 == paVar24) {
    local_270._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_270._8_8_ = puVar11[3];
    local_280._M_allocated_capacity = (size_type)&local_270;
  }
  else {
    local_270._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_280._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar11;
  }
  local_280._8_8_ = puVar11[1];
  *puVar11 = paVar24;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::operator+(&local_210,"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_allocated_capacity != &local_270) {
    uVar18 = local_270._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_210._M_string_length + local_280._8_8_) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar23 = CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                        local_210.field_2._M_local_buf[0]);
    }
    if (uVar23 < local_210._M_string_length + local_280._8_8_) goto LAB_00254080;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_210,0,(char *)0x0,local_280._M_allocated_capacity);
  }
  else {
LAB_00254080:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        (local_280._M_local_buf,(ulong)local_210._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258.field_2._8_8_ = puVar11[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_258._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 == paVar24) {
    local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_370.name.field_2._8_8_ = puVar11[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_370.name._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_370.name._M_string_length = puVar11[1];
  *puVar11 = paVar24;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::__cxx11::string::_M_append(local_140._M_local_buf,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,
                    (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_allocated_capacity != &local_270) {
    operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,(ulong)(local_2a0.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_0025421e:
  std::__cxx11::string::_M_replace((ulong)psVar7,0,(char *)psVar7->_M_string_length,0x36ce38);
  std::__cxx11::string::append((char *)psVar7);
  (*(local_3f0->namer_).super_Namer._vptr_Namer
    [(ulong)(((local_3f0->super_BaseGenerator).parser_)->opts).generate_object_based_api * 2 + 0xf])
            (&local_370,pIVar6,__rhs);
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,
                    (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
  }
  std::__cxx11::string::append((char *)psVar7);
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_230._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 &local_c0);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             (local_280._M_local_buf,local_140._M_allocated_capacity);
  paVar24 = &local_258.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258.field_2._8_8_ = plVar9[3];
    local_258._M_dataplus._M_p = (pointer)paVar24;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_258._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar24) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_allocated_capacity != &local_270) {
    operator_delete((void *)local_280._M_allocated_capacity,local_270._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar7);
  std::__cxx11::string::append(local_e0._M_local_buf);
  std::__cxx11::string::append((char *)&local_1e0);
  local_258._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_e0._M_allocated_capacity,
             local_e0._8_8_ + local_e0._M_allocated_capacity);
  std::__cxx11::string::append((char *)&local_258);
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1e0._M_p);
  paVar20 = &local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
    local_370.name._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != paVar20) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar24) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_allocated_capacity != &local_150) {
    operator_delete((void *)local_160._M_allocated_capacity,local_150._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_140._M_allocated_capacity != &local_130) {
    operator_delete((void *)local_140._M_allocated_capacity,CONCAT71(uStack_12f,local_130) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != &local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
  }
  if ((EnumVal **)local_e0._M_allocated_capacity != &local_d0) {
    operator_delete((void *)local_e0._M_allocated_capacity,
                    (ulong)((long)&(local_d0->name)._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenObjApi(const Parser &parser, StructDef &struct_def,
                 std::string &obj_api_unpack_func, std::string &obj_api_class,
                 import_set &imports) {
    const auto class_name = GetTypeName(struct_def, /*object_api=*/true);

    std::string unpack_func = "\nunpack(): " + class_name +
                              " {\n  return new " + class_name + "(" +
                              (struct_def.fields.vec.empty() ? "" : "\n");
    std::string unpack_to_func = "\nunpackTo(_o: " + class_name + "): void {" +
                                 +(struct_def.fields.vec.empty() ? "" : "\n");

    std::string constructor_func = "constructor(";
    constructor_func += (struct_def.fields.vec.empty() ? "" : "\n");

    const auto has_create =
        struct_def.fixed || CanCreateFactoryMethod(struct_def);

    std::string pack_func_prototype =
        "\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n";

    std::string pack_func_offset_decl;
    std::string pack_func_create_call;

    const auto struct_name = AddImport(imports, struct_def, struct_def).name;

    if (has_create) {
      pack_func_create_call = "  return " + struct_name + ".create" +
                              GetPrefixedName(struct_def) + "(builder" +
                              (struct_def.fields.vec.empty() ? "" : ",\n    ");
    } else {
      pack_func_create_call = "  " + struct_name + ".start" +
                              GetPrefixedName(struct_def) + "(builder);\n";
    }

    if (struct_def.fixed) {
      // when packing struct, nested struct's members instead of the struct's
      // offset are used
      pack_func_create_call +=
          GenStructMemberValueTS(struct_def, "this", ",\n    ", false) + "\n  ";
    }

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      const auto field_method = namer_.Method(field);
      const auto field_field = namer_.Field(field);
      const std::string field_binded_method =
          "this." + field_method + ".bind(this)";

      std::string field_val;
      std::string field_type;
      // a string that declares a variable containing the
      // offset for things that can't be generated inline
      // empty otw
      std::string field_offset_decl;
      // a string that contains values for things that can be created inline or
      // the variable name from field_offset_decl
      std::string field_offset_val;
      const auto field_default_val = GenDefaultValue(field, imports);

      // Emit a scalar field
      const auto is_string = IsString(field.value.type);
      if (IsScalar(field.value.type.base_type) || is_string) {
        const auto has_null_default = is_string || HasNullDefault(field);

        field_type += GenTypeName(imports, field, field.value.type, false,
                                  has_null_default);
        field_val = "this." + namer_.Method(field) + "()";

        if (field.value.type.base_type != BASE_TYPE_STRING) {
          field_offset_val = "this." + namer_.Field(field);
        } else {
          field_offset_decl = GenNullCheckConditional(
              "this." + namer_.Field(field),
              "builder.createString(this." + field_field + "!)", "0");
        }
      }

      // Emit an object field
      else {
        auto is_vector = false;
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            const auto &sd = *field.value.type.struct_def;
            field_type += AddImport(imports, struct_def, sd).object_name;

            const std::string field_accessor =
                "this." + namer_.Method(field) + "()";
            field_val = GenNullCheckConditional(field_accessor,
                                                field_accessor + "!.unpack()");
            auto packing = GenNullCheckConditional(
                "this." + field_field,
                "this." + field_field + "!.pack(builder)", "0");

            if (sd.fixed) {
              field_offset_val = std::move(packing);
            } else {
              field_offset_decl = std::move(packing);
            }

            break;
          }

          case BASE_TYPE_ARRAY: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_VECTOR: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", this." +
                            namer_.Method(field, "Length") + "())";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method +
                            ", this." + namer_.Method(field, "Length") + "())";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_UNION: {
            field_type += GenObjApiUnionTypeTS(imports, struct_def, parser.opts,
                                               *(field.value.type.enum_def));

            field_val = GenUnionValTS(imports, struct_def, field_method,
                                      field.value.type);
            field_offset_decl =
                "builder.createObjectOffset(this." + field_field + ")";
            break;
          }

          default: FLATBUFFERS_ASSERT(0); break;
        }

        // length 0 vector is simply empty instead of null
        field_type += is_vector ? "" : "|null";
      }

      if (!field_offset_decl.empty()) {
        field_offset_decl =
            "  const " + field_field + " = " + field_offset_decl + ";";
      }
      if (field_offset_val.empty()) { field_offset_val = field_field; }

      unpack_func += "    " + field_val;
      unpack_to_func += "  _o." + field_field + " = " + field_val + ";";

      // FIXME: if field_type and field_field are identical, then
      // this generates invalid typescript.
      constructor_func += "  public " + field_field + ": " + field_type +
                          " = " + field_default_val;

      if (!struct_def.fixed) {
        if (!field_offset_decl.empty()) {
          pack_func_offset_decl += field_offset_decl + "\n";
        }

        if (has_create) {
          pack_func_create_call += field_offset_val;
        } else {
          if (field.IsScalarOptional()) {
            pack_func_create_call +=
                "  if (" + field_offset_val + " !== null)\n  ";
          }
          pack_func_create_call += "  " + struct_name + "." +
                                   namer_.Method("add", field) + "(builder, " +
                                   field_offset_val + ");\n";
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) {
        constructor_func += ",\n";

        if (!struct_def.fixed && has_create) {
          pack_func_create_call += ",\n    ";
        }

        unpack_func += ",\n";
        unpack_to_func += "\n";
      } else {
        constructor_func += "\n";
        if (!struct_def.fixed) {
          pack_func_offset_decl += (pack_func_offset_decl.empty() ? "" : "\n");
          pack_func_create_call += "\n  ";
        }

        unpack_func += "\n  ";
        unpack_to_func += "\n";
      }
    }

    constructor_func += "){}\n\n";

    if (has_create) {
      pack_func_create_call += ");";
    } else {
      pack_func_create_call += "return " + struct_name + ".end" +
                               GetPrefixedName(struct_def) + "(builder);";
    }
    obj_api_class = "\n";
    obj_api_class += "export class ";
    obj_api_class += GetTypeName(struct_def, /*object_api=*/true);
    obj_api_class += " implements flatbuffers.IGeneratedObject {\n";
    obj_api_class += constructor_func;
    obj_api_class += pack_func_prototype + pack_func_offset_decl +
                     pack_func_create_call + "\n}";

    obj_api_class += "\n}\n";

    unpack_func += ");\n}";
    unpack_to_func += "}\n";

    obj_api_unpack_func = unpack_func + "\n\n" + unpack_to_func;
  }